

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::Direction,_std::allocator<diy::Direction>_>_>::save
               (BinaryBuffer *bb,Vector *v)

{
  Direction *x;
  const_reference n;
  vector<diy::Direction,_std::allocator<diy::Direction>_> *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  x = (Direction *)
      Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::size(in_RSI);
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (x != (Direction *)0x0) {
    n = Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::operator[]
                  (in_RSI,0);
    Catch::clara::std::vector<diy::Direction,_std::allocator<diy::Direction>_>::size(in_RSI);
    save<diy::Direction>((BinaryBuffer *)in_RSI,x,(size_t)n);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }